

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int porterNext(sqlite3_tokenizer_cursor *pCursor,char **pzToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  char cVar1;
  sqlite3_tokenizer *psVar2;
  int iVar3;
  sqlite3_tokenizer *zOut;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  char *pcVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  byte *local_98;
  uint local_8c;
  int *local_88;
  int *local_80;
  sqlite3_tokenizer *local_78;
  char **local_70;
  uint *local_68;
  int *local_60;
  char zReverse [28];
  
  psVar2 = pCursor[1].pTokenizer;
  local_88 = pnBytes;
  local_80 = piPosition;
  local_70 = pzToken;
  local_68 = (uint *)piStartOffset;
  local_60 = piEndOffset;
  do {
    do {
      iVar14 = *(int *)((long)&pCursor[2].pTokenizer + 4);
      uVar6 = (ulong)iVar14;
      uVar16 = *(uint *)&pCursor[2].pTokenizer;
      if ((int)uVar16 <= iVar14) {
        return 0x65;
      }
      for (; uVar5 = (uint)uVar6, uVar12 = uVar16, (long)uVar6 < (long)(int)uVar16;
          uVar6 = uVar6 + 1) {
        cVar1 = *(char *)((long)&psVar2->pModule + uVar6);
        uVar12 = uVar5;
        if ((cVar1 < '\0') ||
           (('/' < cVar1 && ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)cVar1 - 0x30] != '\0'))
           )) break;
        *(uint *)((long)&pCursor[2].pTokenizer + 4) = uVar5 + 1;
      }
      lVar7 = (long)(int)uVar5;
      uVar15 = (ulong)uVar16;
      if ((int)uVar16 < (int)uVar5) {
        uVar15 = uVar6 & 0xffffffff;
      }
      for (; iVar14 = (int)uVar15, lVar7 < (int)uVar16; lVar7 = lVar7 + 1) {
        cVar1 = *(char *)((long)&psVar2->pModule + lVar7);
        iVar14 = (int)lVar7;
        if ((-1 < cVar1) &&
           ((cVar1 < '0' || ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[(int)cVar1 - 0x30] == '\0'))
           )) break;
        *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar14 + 1;
      }
      uVar16 = iVar14 - uVar12;
    } while (uVar16 == 0 || iVar14 < (int)uVar12);
    zOut = pCursor[4].pTokenizer;
    if (*(int *)&pCursor[5].pTokenizer < (int)uVar16) {
      *(uint *)&pCursor[5].pTokenizer = uVar16 + 0x14;
      zOut = (sqlite3_tokenizer *)sqlite3_realloc(zOut,uVar16 + 0x14);
      if (zOut == (sqlite3_tokenizer *)0x0) {
        return 7;
      }
      pCursor[4].pTokenizer = zOut;
    }
    pcVar11 = (char *)((long)&psVar2->pModule + (long)(int)uVar12);
    local_8c = uVar12;
    if (uVar16 - 0x15 < 0xffffffee) {
LAB_001a06ad:
      copy_stemmer(pcVar11,uVar16,(char *)zOut,local_88);
      goto LAB_001a06d2;
    }
    pbVar8 = (byte *)(zReverse + 0x16);
    lVar7 = 0x1700000000;
    for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
      bVar13 = pcVar11[uVar6];
      if ((byte)(bVar13 + 0xbf) < 0x1a) {
        bVar13 = bVar13 | 0x20;
      }
      else if (0x19 < (byte)(bVar13 + 0x9f)) goto LAB_001a06ad;
      *pbVar8 = bVar13;
      lVar7 = lVar7 + -0x100000000;
      pbVar8 = pbVar8 + -1;
    }
    zReverse[0x1b] = '\0';
    zReverse[0x17] = '\0';
    zReverse[0x18] = '\0';
    zReverse[0x19] = '\0';
    zReverse[0x1a] = '\0';
    local_98 = (byte *)(zReverse + (lVar7 >> 0x20));
    local_78 = zOut;
    if ((((*local_98 == 0x73) &&
         (iVar3 = stem((char **)&local_98,"sess","ss",(_func_int_char_ptr *)0x0), iVar3 == 0)) &&
        (iVar3 = stem((char **)&local_98,"sei","i",(_func_int_char_ptr *)0x0), iVar3 == 0)) &&
       (iVar3 = stem((char **)&local_98,"ss","ss",(_func_int_char_ptr *)0x0), iVar3 == 0)) {
      local_98 = local_98 + 1;
    }
    pbVar8 = local_98;
    iVar3 = stem((char **)&local_98,"dee","ee",m_gt_0);
    if ((((iVar3 == 0) &&
         ((iVar3 = stem((char **)&local_98,"gni","",hasVowel), iVar3 != 0 ||
          (iVar3 = stem((char **)&local_98,"de","",hasVowel), iVar3 != 0)))) && (local_98 != pbVar8)
        ) && (((iVar3 = stem((char **)&local_98,"ta","ate",(_func_int_char_ptr *)0x0), iVar3 == 0 &&
               (iVar3 = stem((char **)&local_98,"lb","ble",(_func_int_char_ptr *)0x0), iVar3 == 0))
              && (iVar3 = stem((char **)&local_98,"zi","ize",(_func_int_char_ptr *)0x0),
                 pbVar8 = local_98, iVar3 == 0)))) {
      iVar3 = isConsonant((char *)local_98);
      if (((iVar3 == 0) || (*pbVar8 != pbVar8[1])) ||
         ((uVar16 = *pbVar8 - 0x6c, uVar16 < 0xf && ((0x4081U >> (uVar16 & 0x1f) & 1) != 0)))) {
        iVar3 = m_eq_1((char *)pbVar8);
        if ((iVar3 != 0) && (iVar3 = star_oh((char *)pbVar8), iVar3 != 0)) {
          local_98 = pbVar8 + -1;
          pbVar8[-1] = 0x65;
        }
      }
      else {
        local_98 = pbVar8 + 1;
      }
    }
    pbVar8 = local_98;
    if ((*local_98 == 0x79) && (iVar3 = hasVowel((char *)(local_98 + 1)), iVar3 != 0)) {
      *pbVar8 = 0x69;
    }
    switch(pbVar8[1]) {
    case 0x61:
      iVar3 = stem((char **)&local_98,"lanoita","ate",m_gt_0);
      if (iVar3 == 0) {
        pcVar9 = "lanoit";
        pcVar11 = "tion";
        goto LAB_001a0b1e;
      }
      break;
    case 99:
      iVar3 = stem((char **)&local_98,"icne","ence",m_gt_0);
      if (iVar3 == 0) {
        pcVar9 = "icna";
        pcVar11 = "ance";
        goto LAB_001a0b1e;
      }
      break;
    case 0x65:
      pcVar9 = "rezi";
      pcVar11 = "ize";
      goto LAB_001a0b1e;
    case 0x67:
      pcVar9 = "igol";
      pcVar11 = "log";
LAB_001a0b1e:
      stem((char **)&local_98,pcVar9,pcVar11,m_gt_0);
      break;
    case 0x6c:
      iVar3 = stem((char **)&local_98,"ilb","ble",m_gt_0);
      if (((iVar3 == 0) && (iVar3 = stem((char **)&local_98,"illa","al",m_gt_0), iVar3 == 0)) &&
         ((iVar3 = stem((char **)&local_98,"iltne","ent",m_gt_0), iVar3 == 0 &&
          (iVar3 = stem((char **)&local_98,"ile","e",m_gt_0), iVar3 == 0)))) {
        pcVar9 = "ilsuo";
LAB_001a0ccd:
        pcVar11 = "ous";
        goto LAB_001a0b1e;
      }
      break;
    case 0x6f:
      iVar3 = stem((char **)&local_98,"noitazi","ize",m_gt_0);
      if ((iVar3 == 0) && (iVar3 = stem((char **)&local_98,"noita","ate",m_gt_0), iVar3 == 0)) {
        pcVar9 = "rota";
        pcVar11 = "ate";
        goto LAB_001a0b1e;
      }
      break;
    case 0x73:
      iVar3 = stem((char **)&local_98,"msila","al",m_gt_0);
      if (((iVar3 == 0) && (iVar3 = stem((char **)&local_98,"ssenevi","ive",m_gt_0), iVar3 == 0)) &&
         (iVar3 = stem((char **)&local_98,"ssenluf","ful",m_gt_0), iVar3 == 0)) {
        pcVar9 = "ssensuo";
        goto LAB_001a0ccd;
      }
      break;
    case 0x74:
      iVar3 = stem((char **)&local_98,"itila","al",m_gt_0);
      if ((iVar3 == 0) && (iVar3 = stem((char **)&local_98,"itivi","ive",m_gt_0), iVar3 == 0)) {
        pcVar9 = "itilib";
        pcVar11 = "ble";
        goto LAB_001a0b1e;
      }
    }
    bVar13 = *local_98;
    if (bVar13 == 0x73) {
      pcVar11 = "ssen";
LAB_001a0bec:
      pcVar9 = "";
LAB_001a0bef:
      stem((char **)&local_98,pcVar11,pcVar9,m_gt_0);
    }
    else {
      if (bVar13 == 0x69) {
        pcVar11 = "itici";
        pcVar9 = "ic";
        goto LAB_001a0bef;
      }
      if (bVar13 == 0x6c) {
        iVar3 = stem((char **)&local_98,"laci","ic",m_gt_0);
        if (iVar3 == 0) {
          pcVar11 = "luf";
          goto LAB_001a0bec;
        }
      }
      else if (((bVar13 == 0x65) &&
               (iVar3 = stem((char **)&local_98,"etaci","ic",m_gt_0), iVar3 == 0)) &&
              (iVar3 = stem((char **)&local_98,"evita","",m_gt_0), iVar3 == 0)) {
        pcVar11 = "ezila";
        pcVar9 = "al";
        goto LAB_001a0bef;
      }
    }
    switch(local_98[1]) {
    case 0x61:
      if (*local_98 == 0x6c) {
LAB_001a0d7f:
        pbVar8 = local_98 + 2;
LAB_001a0db6:
        iVar3 = m_gt_1((char *)pbVar8);
        if (iVar3 != 0) {
          local_98 = pbVar8;
        }
      }
      break;
    case 99:
      if (((*local_98 == 0x65) && (local_98[2] == 0x6e)) && ((local_98[3] | 4) == 0x65)) {
LAB_001a0d9f:
        pbVar8 = local_98 + 4;
        goto LAB_001a0db6;
      }
      break;
    case 0x65:
      if (*local_98 == 0x72) goto LAB_001a0d7f;
      break;
    case 0x69:
      if (*local_98 == 99) goto LAB_001a0d7f;
      break;
    case 0x6c:
      if (((*local_98 == 0x65) && (local_98[2] == 0x62)) && ((local_98[3] | 8) == 0x69))
      goto LAB_001a0d9f;
      break;
    case 0x6e:
      if (*local_98 == 0x74) {
        if (local_98[2] == 0x65) {
          iVar3 = stem((char **)&local_98,"tneme","",m_gt_1);
          if ((iVar3 == 0) && (iVar3 = stem((char **)&local_98,"tnem","",m_gt_1), iVar3 == 0)) {
            pcVar11 = "tne";
            goto LAB_001a0def;
          }
        }
        else if (local_98[2] == 0x61) goto LAB_001a0db2;
      }
      break;
    case 0x6f:
      if (*local_98 == 0x75) goto LAB_001a0d7f;
      if ((byte)(local_98[3] + 0x8d) < 2) {
        pcVar11 = "noi";
        goto LAB_001a0def;
      }
      break;
    case 0x73:
      if (*local_98 == 0x6d) {
LAB_001a0d6d:
        if (local_98[2] == 0x69) goto LAB_001a0db2;
      }
      break;
    case 0x74:
      iVar3 = stem((char **)&local_98,"eta","",m_gt_1);
      if (iVar3 == 0) {
        pcVar11 = "iti";
LAB_001a0def:
        stem((char **)&local_98,pcVar11,"",m_gt_1);
      }
      break;
    case 0x75:
      if ((*local_98 == 0x73) && (local_98[2] == 0x6f)) {
LAB_001a0db2:
        pbVar8 = local_98 + 3;
        goto LAB_001a0db6;
      }
      break;
    case 0x76:
    case 0x7a:
      if (*local_98 == 0x65) goto LAB_001a0d6d;
    }
    pbVar8 = local_98;
    if (*local_98 == 0x65) {
      pbVar10 = local_98 + 1;
      iVar3 = m_gt_1((char *)pbVar10);
      if ((iVar3 != 0) ||
         ((iVar3 = m_eq_1((char *)pbVar10), iVar3 != 0 &&
          (iVar3 = star_oh((char *)pbVar10), iVar3 == 0)))) {
        pbVar8 = pbVar10;
        local_98 = pbVar10;
      }
    }
    iVar3 = m_gt_1((char *)pbVar8);
    piPosition = local_80;
    if (((iVar3 != 0) && (*pbVar8 == 0x6c)) && (pbVar8[1] == 0x6c)) {
      pbVar8 = pbVar8 + 1;
      local_98 = pbVar8;
    }
    sVar4 = strlen((char *)pbVar8);
    *local_88 = (int)sVar4;
    pbVar10 = (byte *)((long)&local_78->pModule + (long)(int)sVar4);
    bVar13 = 0;
    while( true ) {
      *pbVar10 = bVar13;
      bVar13 = *pbVar8;
      if (bVar13 == 0) break;
      pbVar8 = pbVar8 + 1;
      pbVar10 = pbVar10 + -1;
    }
LAB_001a06d2:
    *local_70 = (char *)pCursor[4].pTokenizer;
    *local_68 = local_8c;
    *local_60 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    iVar3 = *(int *)&pCursor[3].pTokenizer;
    *(int *)&pCursor[3].pTokenizer = iVar3 + 1;
    *piPosition = iVar3;
    if ((int)local_8c < iVar14) {
      return 0;
    }
  } while( true );
}

Assistant:

static int porterNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by porterOpen */
  const char **pzToken,               /* OUT: *pzToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  porter_tokenizer_cursor *c = (porter_tokenizer_cursor *) pCursor;
  const char *z = c->zInput;

  while( c->iOffset<c->nInput ){
    int iStartOffset, ch;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nInput && isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nInput && !isDelim(z[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int n = c->iOffset-iStartOffset;
      if( n>c->nAllocated ){
        char *pNew;
        c->nAllocated = n+20;
        pNew = sqlite3_realloc(c->zToken, c->nAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->zToken = pNew;
      }
      porter_stemmer(&z[iStartOffset], n, c->zToken, pnBytes);
      *pzToken = c->zToken;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;
      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}